

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

int __thiscall FLineIdIterator::Next(FLineIdIterator *this)

{
  int iVar1;
  FTagItem *pFVar2;
  uint uVar3;
  
  pFVar2 = tagManager.allIDs.Array;
  uVar3 = this->start;
  while (-1 < (int)uVar3) {
    if (pFVar2[uVar3].tag == this->searchtag) goto LAB_004557f4;
    uVar3 = pFVar2[uVar3].nexttag;
    this->start = uVar3;
  }
  if (uVar3 == 0xffffffff) {
    return -1;
  }
LAB_004557f4:
  iVar1 = pFVar2[(int)uVar3].target;
  this->start = pFVar2[(int)uVar3].nexttag;
  return iVar1;
}

Assistant:

int FLineIdIterator::Next()
{
	while (start >= 0 && tagManager.allIDs[start].tag != searchtag) start = tagManager.allIDs[start].nexttag;
	if (start == -1) return -1;
	int ret = tagManager.allIDs[start].target;
	start = tagManager.allIDs[start].nexttag;
	return ret;
}